

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cached-powers.cc
# Opt level: O3

void FIX::double_conversion::PowersOfTenCache::GetCachedPowerForDecimalExponent
               (int requested_exponent,DiyFp *power,int *found_exponent)

{
  short sVar1;
  int iVar2;
  long lVar3;
  
  if (requested_exponent < -0x15c) {
    __assert_fail("kMinDecimalExponent <= requested_exponent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/cached-powers.cc"
                  ,0xa5,
                  "static void FIX::double_conversion::PowersOfTenCache::GetCachedPowerForDecimalExponent(int, DiyFp *, int *)"
                 );
  }
  if (0x15b < requested_exponent) {
    __assert_fail("requested_exponent < kMaxDecimalExponent + kDecimalExponentDistance",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/cached-powers.cc"
                  ,0xa6,
                  "static void FIX::double_conversion::PowersOfTenCache::GetCachedPowerForDecimalExponent(int, DiyFp *, int *)"
                 );
  }
  lVar3 = (ulong)(requested_exponent + 0x15cU >> 3) * 0x10;
  sVar1 = *(short *)(kCachedPowers + lVar3 + 8);
  iVar2 = (int)*(short *)(kCachedPowers + lVar3 + 10);
  power->f_ = *(uint64_t *)(kCachedPowers + lVar3);
  power->e_ = (int)sVar1;
  *found_exponent = iVar2;
  if (requested_exponent < iVar2) {
    __assert_fail("*found_exponent <= requested_exponent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/cached-powers.cc"
                  ,0xac,
                  "static void FIX::double_conversion::PowersOfTenCache::GetCachedPowerForDecimalExponent(int, DiyFp *, int *)"
                 );
  }
  if (requested_exponent < iVar2 + 8) {
    return;
  }
  __assert_fail("requested_exponent < *found_exponent + kDecimalExponentDistance",
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/cached-powers.cc"
                ,0xad,
                "static void FIX::double_conversion::PowersOfTenCache::GetCachedPowerForDecimalExponent(int, DiyFp *, int *)"
               );
}

Assistant:

void PowersOfTenCache::GetCachedPowerForDecimalExponent(int requested_exponent,
                                                        DiyFp* power,
                                                        int* found_exponent) {
  ASSERT(kMinDecimalExponent <= requested_exponent);
  ASSERT(requested_exponent < kMaxDecimalExponent + kDecimalExponentDistance);
  int index =
      (requested_exponent + kCachedPowersOffset) / kDecimalExponentDistance;
  CachedPower cached_power = kCachedPowers[index];
  *power = DiyFp(cached_power.significand, cached_power.binary_exponent);
  *found_exponent = cached_power.decimal_exponent;
  ASSERT(*found_exponent <= requested_exponent);
  ASSERT(requested_exponent < *found_exponent + kDecimalExponentDistance);
}